

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int64_t __thiscall llvm::APInt::srem(APInt *this,int64_t RHS)

{
  bool bVar1;
  uint64_t uVar2;
  APInt *this_00;
  APInt AStack_48;
  APInt local_38;
  APInt local_28;
  
  bVar1 = isNegative(this);
  if (bVar1) {
    if (RHS < 0) {
      this_00 = &local_28;
      APInt(this_00,this);
      operator-((llvm *)&AStack_48,this_00);
      RHS = -RHS;
    }
    else {
      this_00 = &local_38;
      APInt(this_00,this);
      operator-((llvm *)&AStack_48,this_00);
    }
    uVar2 = urem(&AStack_48,RHS);
    ~APInt(&AStack_48);
    ~APInt(this_00);
    return -uVar2;
  }
  if (RHS < 0) {
    RHS = -RHS;
  }
  uVar2 = urem(this,RHS);
  return uVar2;
}

Assistant:

int64_t APInt::srem(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS < 0)
    return this->urem(-RHS);
  return this->urem(RHS);
}